

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adapter.cc
# Opt level: O3

bool __thiscall RaptorServerAdapter::Init(RaptorServerAdapter *this,RaptorOptions *options)

{
  raptor_error e;
  undefined1 local_30 [24];
  _func_int *local_18 [2];
  
  raptor::TcpServer::Init
            ((TcpServer *)local_30,
             (RaptorOptions *)
             (this->_impl).super___shared_ptr<raptor::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  if ((Status *)local_30._0_8_ != (Status *)0x0) {
    raptor::Status::ToString_abi_cxx11_((string *)(local_30 + 8),(Status *)local_30._0_8_);
    raptor::LogFormatPrint
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/surface/adapter.cc"
               ,0x29,kLogLevelError,"server adapter: init (%s)",local_30._8_8_);
    if ((_func_int **)local_30._8_8_ != local_18) {
      operator_delete((void *)local_30._8_8_);
    }
  }
  raptor::RefCountedPtr<raptor::Status>::~RefCountedPtr((RefCountedPtr<raptor::Status> *)local_30);
  return (Status *)local_30._0_8_ == (Status *)0x0;
}

Assistant:

bool RaptorServerAdapter::Init(const RaptorOptions* options) {
    raptor_error e = _impl->Init(options);
    if (e != RAPTOR_ERROR_NONE) {
        log_error("server adapter: init (%s)", e->ToString().c_str());
        return false;
    }
    return true;
}